

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

shared_ptr<SchemePort>
get_input_port(list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
               *l,string *proc)

{
  pointer pcVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *extraout_RAX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  runtime_error *this_00;
  _List_node_base *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  SchemePort *__tmp;
  element_type *peVar6;
  undefined1 auVar7 [16];
  shared_ptr<SchemePort> sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  (l->
  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>).
  _M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)
       current_input_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var3 = current_input_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  (l->
  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>).
  _M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)
       current_input_port.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var3._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var3._M_pi)->_M_use_count = (_Var3._M_pi)->_M_use_count + 1;
    }
  }
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX;
  if ((proc->field_2)._M_allocated_capacity == 0) {
    peVar6 = (element_type *)
             (l->
             super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
             )._M_impl._M_node.super__List_node_base._M_next;
  }
  else {
    pcVar1 = (proc->_M_dataplus)._M_p;
    lVar2 = *(long *)(pcVar1 + 0x10);
    if (lVar2 == 0) {
      p_Var4 = (_List_node_base *)0x0;
      peVar6 = (element_type *)0x0;
    }
    else {
      auVar7 = __dynamic_cast(lVar2,&SchemeObject::typeinfo,&SchemePort::typeinfo,0);
      _Var5._M_pi = auVar7._8_8_;
      _Var3._M_pi = auVar7._0_8_;
      p_Var4 = (_List_node_base *)0x0;
      peVar6 = (element_type *)0x0;
      if ((element_type *)_Var3._M_pi != (element_type *)0x0) {
        p_Var4 = *(_List_node_base **)(pcVar1 + 0x18);
        peVar6 = (element_type *)_Var3._M_pi;
        if (p_Var4 == (_List_node_base *)0x0) {
          p_Var4 = (_List_node_base *)0x0;
        }
        else {
          _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&p_Var4->_M_prev = *(int *)&p_Var4->_M_prev + 1;
            UNLOCK();
          }
          else {
            *(int *)&p_Var4->_M_prev = *(int *)&p_Var4->_M_prev + 1;
          }
        }
      }
    }
    (l->
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)peVar6;
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (l->
           super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
    (l->
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = p_Var4;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RAX;
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
    }
  }
  if ((peVar6 != (element_type *)0x0) &&
     ((peVar6->input_stream).
      super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0)) {
    sVar8.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi
    ;
    sVar8.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var3._M_pi;
    return (shared_ptr<SchemePort>)sVar8.super___shared_ptr<SchemePort,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,in_RDX,": bad port");
  std::runtime_error::runtime_error(this_00,(string *)&bStack_48);
  *(undefined ***)this_00 = &PTR__runtime_error_0016b300;
  __cxa_throw(this_00,&eval_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::shared_ptr<SchemePort>
get_input_port(const std::list<std::shared_ptr<SchemeObject>> &l, const std::string &proc)
{
    auto port = current_input_port;
    if(l.size())
        port = std::dynamic_pointer_cast<SchemePort>(l.front());
    if(!port || !port->input_stream)
        throw eval_error(proc + ": bad port");
    return port;
}